

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockSingleStructCase::init
          (BlockSingleStructCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderInterface *this_00;
  deUint32 extraout_EAX;
  deUint32 dVar1;
  StructType *this_01;
  BufferBlock *this_02;
  BufferVar local_78;
  VarType local_38;
  
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  this_01 = bb::ShaderInterface::allocStruct(this_00,"S");
  glu::VarType::VarType((VarType *)&local_78,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_01,"a",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::VarType(&local_38,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&local_78,&local_38,4);
  glu::StructType::addMember(this_01,"b",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::~VarType(&local_38);
  glu::VarType::VarType((VarType *)&local_78,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_01,"c",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  this_02 = bb::ShaderInterface::allocBlock(this_00,"Block");
  glu::VarType::VarType(&local_38,this_01);
  bb::BufferVar::BufferVar(&local_78,"s",&local_38,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (&this_02->m_variables,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_38);
  dVar1 = this->m_layoutFlags;
  this_02->m_flags = dVar1;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::_M_replace
              ((ulong)&this_02->m_instanceName,0,(char *)(this_02->m_instanceName)._M_string_length,
               0x1c3adee);
    bb::BufferBlock::setArraySize(this_02,this->m_numInstances);
    dVar1 = extraout_EAX;
  }
  return dVar1;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP)); // \todo [pyry] First member is unused.
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}